

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitIteratedLogical
          (ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,IteratedLogicalExpr e)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  Kind KVar1;
  BasicWriter<char> *pBVar2;
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
  *in_RSI;
  char *in_RDI;
  char *op;
  int prec;
  BasicStringRef<char> *this_00;
  int precedence;
  BasicWriter<char> *in_stack_ffffffffffffffb0;
  char *e_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  
  this_00 = *(BasicStringRef<char> **)(in_RDI + 8);
  fmt::BasicStringRef<char>::BasicStringRef(this_00,in_RDI);
  value.data_._4_4_ = in_stack_ffffffffffffffbc;
  value.data_._0_4_ = in_stack_ffffffffffffffb8;
  value.size_ = in_stack_ffffffffffffffc0;
  pBVar2 = fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,value);
  precedence = (int)((ulong)pBVar2 >> 0x20);
  KVar1 = internal::ExprBase::kind((ExprBase *)0x4e9604);
  mp::expr::str(KVar1);
  fmt::BasicStringRef<char>::BasicStringRef(this_00,in_RDI);
  value_00.data_._4_4_ = in_stack_ffffffffffffffbc;
  value_00.data_._0_4_ = in_stack_ffffffffffffffb8;
  value_00.size_ = in_stack_ffffffffffffffc0;
  pBVar2 = fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,value_00);
  fmt::BasicStringRef<char>::BasicStringRef(this_00,in_RDI);
  value_01.data_._4_4_ = in_stack_ffffffffffffffbc;
  value_01.data_._0_4_ = in_stack_ffffffffffffffb8;
  value_01.size_ = in_stack_ffffffffffffffc0;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffb0,value_01);
  e_00 = " && ";
  KVar1 = internal::ExprBase::kind((ExprBase *)0x4e9674);
  if (KVar1 == EXISTS) {
    e_00 = " || ";
  }
  ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
  WriteArgs<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
            (in_RSI,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>
                     )e_00,(char *)pBVar2,precedence);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitIteratedLogical(IteratedLogicalExpr e) {
  // There is no way to produce an AMPL forall/exists expression because
  // its indexing is not available any more. So we write a count expression
  // instead with a comment about the original expression.
  writer_ << "/* " << str(e.kind()) << " */ ";
  int prec = prec::LOGICAL_AND + 1;
  const char *op = " && ";
  if (e.kind() == expr::EXISTS) {
    prec = prec::LOGICAL_OR + 1;
    op = " || ";
  }
  WriteArgs(e, op, prec);
}